

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O3

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::generate(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *base)

{
  DataArray<int> *this_00;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  undefined8 uVar1;
  double dVar2;
  byte bVar3;
  pointer pnVar4;
  pointer pnVar5;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  int *piVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pAVar9;
  int iVar10;
  long lVar11;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_03;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  uint *puVar18;
  pointer *ppnVar19;
  uint *puVar20;
  undefined4 *puVar21;
  DataKey *pDVar22;
  undefined4 *puVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  long lVar25;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pAVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  byte bVar31;
  ulong uVar32;
  Real a;
  SPxId tmpId;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  ulong local_3d0;
  uint local_3bc;
  SPxId *local_3b0;
  undefined8 local_3a8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3a0;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_398;
  DataArray<int> *local_390;
  ulong local_388;
  DataKey local_380;
  undefined1 local_378 [8];
  int *piStack_370;
  uint local_368 [23];
  undefined3 uStack_30b;
  int iStack_308;
  bool bStack_304;
  undefined8 local_300;
  cpp_dec_float<200U,_int,_void> local_2f8;
  Desc local_278;
  cpp_dec_float<200U,_int,_void> local_238;
  undefined1 local_1b0 [8];
  int *local_1a8;
  uint local_1a0 [24];
  int local_140;
  bool local_13c;
  fpclass_type local_138;
  int32_t iStack_134;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar31 = 0;
  local_380.info = 0;
  local_380.idx = -1;
  this_00 = &this->forbidden;
  DataArray<int>::reSize(this_00,(base->thecovectors->set).thenum);
  this_01 = &this->rowWeight;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&this_01->data,
           (long)(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  this_02 = &this->colWeight;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&this_02->data,
           (long)(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  DataArray<bool>::reSize
            (&this->rowRight,
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  DataArray<bool>::reSize
            (&this->colUp,
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  pAVar26 = this_02;
  pAVar9 = this_01;
  if (base->theRep == COLUMN) {
    pAVar26 = this_01;
    pAVar9 = this_02;
  }
  this->weight = pAVar9;
  this->coWeight = pAVar26;
  local_3a0 = this_01;
  local_398 = this_02;
  (*(this->
    super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxStarter[8])(this,base);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Desc::Desc(&local_278,base);
  iVar14 = (base->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum +
           (base->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  local_3b0 = (SPxId *)0x0;
  local_3a8 = 0x3ff3333333333333;
  iVar15 = iVar14;
  if (iVar14 < 1) {
    iVar15 = 0;
    iVar14 = 1;
  }
  spx_alloc<soplex::SPxId*>(&local_3b0,iVar14);
  local_378._4_4_ =
       (base->
       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum;
  piStack_370 = (int *)0x0;
  local_368[0] = 0x33333333;
  local_368[1] = 0x3ff33333;
  local_378._0_4_ = local_378._4_4_;
  if ((int)local_378._4_4_ < 1) {
    local_378._4_4_ = 1;
    local_378._0_4_ = 0;
  }
  spx_alloc<int*>(&piStack_370,local_378._4_4_);
  uVar28 = (base->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  local_1a8 = (int *)0x0;
  local_1a0[0] = 0x33333333;
  local_1a0[1] = 0x3ff33333;
  local_1b0._0_4_ = 0;
  if (0 < (int)uVar28) {
    local_1b0._0_4_ = uVar28;
  }
  local_1b0._4_4_ = 1;
  if (0 < (int)uVar28) {
    local_1b0._4_4_ = local_1b0._0_4_;
  }
  spx_alloc<int*>(&local_1a8,local_1b0._4_4_);
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar11 = 0;
    do {
      piStack_370[lVar11] = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_130.data._M_elems._0_8_ =
       (local_3a0->data).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (piStack_370,local_378._0_4_,
             (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&local_130,0,true);
  if (0 < (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar11 = 0;
    do {
      local_1a8[lVar11] = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_130.data._M_elems._0_8_ =
       (local_398->data).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (local_1a8,local_1b0._0_4_,
             (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&local_130,0,true);
  local_390 = this_00;
  if (0 < iVar15) {
    uVar29 = 0;
    iVar16 = 0;
    iVar14 = 0;
    do {
      lVar12 = (long)iVar14;
      pnVar4 = (local_3a0->data).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar25 = (long)iVar16;
      lVar11 = (long)local_1a8[lVar25];
      iVar27 = (int)uVar29;
      if (pnVar4[piStack_370[lVar12]].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_005928ed:
        local_238.data._M_elems._0_8_ =
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar11];
        SPxColId::SPxColId((SPxColId *)&local_2f8,(DataKey *)&local_238);
        iVar16 = iVar16 + 1;
        local_3b0[iVar27].super_DataKey.info = local_2f8.data._M_elems[0];
        local_3b0[iVar27].super_DataKey.idx = local_2f8.data._M_elems[1];
        local_3b0[iVar27].super_DataKey.info = 1;
        uVar28 = iVar27 + 1;
        uVar29 = (ulong)uVar28;
        if (((base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum <= iVar16) && ((int)uVar28 < iVar15)) {
          uVar13 = (long)(int)uVar28;
          do {
            local_238.data._M_elems._0_8_ =
                 (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[piStack_370[lVar12]];
            SPxRowId::SPxRowId((SPxRowId *)&local_2f8,(DataKey *)&local_238);
            lVar12 = lVar12 + 1;
            uVar29 = uVar13 + 1;
            local_3b0[uVar13].super_DataKey.info = local_2f8.data._M_elems[0];
            local_3b0[uVar13].super_DataKey.idx = local_2f8.data._M_elems[1];
            local_3b0[uVar13].super_DataKey.info = -1;
            uVar13 = uVar29;
          } while ((long)uVar29 < (long)iVar15);
          iVar14 = (int)lVar12;
        }
      }
      else {
        pnVar5 = (local_398->data).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pnVar5[lVar11].m_backend.fpclass == cpp_dec_float_NaN) goto LAB_005928ed;
        iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar4[piStack_370[lVar12]].m_backend,&pnVar5[lVar11].m_backend);
        if (-1 < iVar10) {
          lVar11 = (long)local_1a8[lVar25];
          goto LAB_005928ed;
        }
        local_238.data._M_elems._0_8_ =
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[piStack_370[lVar12]];
        SPxRowId::SPxRowId((SPxRowId *)&local_2f8,(DataKey *)&local_238);
        iVar14 = iVar14 + 1;
        local_3b0[iVar27].super_DataKey.info = local_2f8.data._M_elems[0];
        local_3b0[iVar27].super_DataKey.idx = local_2f8.data._M_elems[1];
        local_3b0[iVar27].super_DataKey.info = -1;
        uVar28 = iVar27 + 1;
        uVar29 = (ulong)uVar28;
        if (((base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum <= iVar14) && ((int)uVar28 < iVar15)) {
          uVar13 = (long)(int)uVar28;
          do {
            local_238.data._M_elems._0_8_ =
                 (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[local_1a8[lVar25]];
            SPxColId::SPxColId((SPxColId *)&local_2f8,(DataKey *)&local_238);
            lVar25 = lVar25 + 1;
            uVar29 = uVar13 + 1;
            local_3b0[uVar13].super_DataKey.info = local_2f8.data._M_elems[0];
            local_3b0[uVar13].super_DataKey.idx = local_2f8.data._M_elems[1];
            local_3b0[uVar13].super_DataKey.info = 1;
            uVar13 = uVar29;
          } while ((long)uVar29 < (long)iVar15);
          iVar16 = (int)lVar25;
        }
      }
    } while ((int)uVar29 < iVar15);
  }
  if (local_1a8 != (int *)0x0) {
    free(local_1a8);
  }
  if (piStack_370 != (int *)0x0) {
    free(piStack_370);
  }
  pSVar6 = base->thecovectors;
  uVar28 = (pSVar6->set).thenum;
  local_3d0 = (ulong)uVar28;
  if (0 < (int)uVar28) {
    piVar7 = (this->forbidden).data;
    lVar11 = 0;
    do {
      piVar7[lVar11] = 0;
      lVar11 = lVar11 + 1;
      local_3d0 = (ulong)(pSVar6->set).thenum;
    } while (lVar11 < (long)local_3d0);
  }
  bVar30 = base->theRep == COLUMN;
  uVar29 = (ulong)(iVar15 - 1);
  if (bVar30) {
    uVar29 = 0;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<200U,_int,_void> *)local_1b0,0,(type *)0x0);
  iVar14 = (int)uVar29;
  if ((-1 < iVar14) && (iVar14 < iVar15)) {
    local_3bc = (uint)bVar30 * 2 - 1;
    uVar13 = (ulong)local_3bc;
    local_3bc = iVar14 + local_3bc;
    local_388 = uVar13;
    do {
      local_380 = local_3b0[uVar29].super_DataKey;
      this_03 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::vector(base,(SPxId *)&local_380);
      if (this_03->memused == 1) {
        uVar28 = this_03->m_elem->idx;
        iVar14 = (this->forbidden).data[(int)uVar28];
        if (1 < iVar14) goto LAB_00592eb0;
        local_3d0 = (ulong)((int)local_3d0 + (uint)(iVar14 == 1));
LAB_00592e6e:
        if ((int)uVar28 < 0) goto LAB_00592eb0;
        (this->forbidden).data[uVar28] = 2;
        if (base->theRep == COLUMN) {
          setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_278,base,local_3b0 + uVar29);
        }
        else {
          setPrimalStatus(this,&local_278,base,local_3b0 + uVar29);
        }
        lVar11 = (long)this_03->memused;
        if (0 < lVar11) {
          uVar13 = lVar11 + 1;
          lVar11 = lVar11 * 0x84;
          do {
            pNVar8 = this_03->m_elem;
            puVar21 = (undefined4 *)((long)pNVar8[-1].val.m_backend.data._M_elems + lVar11);
            puVar23 = (undefined4 *)local_378;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar23 = *puVar21;
              puVar21 = puVar21 + (ulong)bVar31 * -2 + 1;
              puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
            }
            iStack_308 = *(int *)((long)(pNVar8->val).m_backend.data._M_elems + lVar11 + -0x14);
            bStack_304 = *(bool *)((long)(pNVar8->val).m_backend.data._M_elems + lVar11 + -0x10);
            local_300 = *(undefined8 *)((long)(pNVar8->val).m_backend.data._M_elems + lVar11 + -0xc)
            ;
            iVar14 = *(int *)((long)(this_03->m_elem->val).m_backend.data._M_elems + lVar11 + -4);
            iVar16 = (*(this->
                       super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxStarter[6])();
            a = Tolerances::floatingPointFeastol(*(Tolerances **)CONCAT44(extraout_var_00,iVar16));
            local_2f8.fpclass = cpp_dec_float_finite;
            local_2f8.prec_elem = 0x1c;
            local_2f8.data._M_elems[0] = 0;
            local_2f8.data._M_elems[1] = 0;
            local_2f8.data._M_elems[2] = 0;
            local_2f8.data._M_elems[3] = 0;
            local_2f8.data._M_elems[4] = 0;
            local_2f8.data._M_elems[5] = 0;
            local_2f8.data._M_elems[6] = 0;
            local_2f8.data._M_elems[7] = 0;
            local_2f8.data._M_elems[8] = 0;
            local_2f8.data._M_elems[9] = 0;
            local_2f8.data._M_elems[10] = 0;
            local_2f8.data._M_elems[0xb] = 0;
            local_2f8.data._M_elems[0xc] = 0;
            local_2f8.data._M_elems[0xd] = 0;
            local_2f8.data._M_elems[0xe] = 0;
            local_2f8.data._M_elems[0xf] = 0;
            local_2f8.data._M_elems[0x10] = 0;
            local_2f8.data._M_elems[0x11] = 0;
            local_2f8.data._M_elems[0x12] = 0;
            local_2f8.data._M_elems[0x13] = 0;
            local_2f8.data._M_elems[0x14] = 0;
            local_2f8.data._M_elems[0x15] = 0;
            local_2f8.data._M_elems[0x16] = 0;
            local_2f8.data._M_elems[0x17] = 0;
            local_2f8.data._M_elems[0x18] = 0;
            local_2f8.data._M_elems[0x19] = 0;
            local_2f8.data._M_elems._104_5_ = 0;
            local_2f8.data._M_elems[0x1b]._1_3_ = 0;
            local_2f8.exp = 0;
            local_2f8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_2f8,a);
            if ((this->forbidden).data[iVar14] == 0) {
              pDVar22 = (DataKey *)&local_2f8;
              pcVar24 = &local_238;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar24->data)._M_elems[0] = pDVar22->info;
                pDVar22 = (DataKey *)&pDVar22[-(ulong)bVar31].idx;
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_238.exp = local_2f8.exp;
              local_238.neg = local_2f8.neg;
              local_238.fpclass = local_2f8.fpclass;
              local_238.prec_elem = local_2f8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_238,(cpp_dec_float<200U,_int,_void> *)local_1b0);
              if (((fpclass_type)local_300 == cpp_dec_float_NaN) ||
                 (local_238.fpclass == cpp_dec_float_NaN)) {
LAB_00593091:
                puVar21 = (undefined4 *)local_378;
                ppnVar19 = (pointer *)&local_130;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *(undefined4 *)ppnVar19 = *puVar21;
                  puVar21 = puVar21 + (ulong)bVar31 * -2 + 1;
                  ppnVar19 = (pointer *)((long)ppnVar19 + (ulong)bVar31 * -8 + 4);
                }
                local_130.exp = iStack_308;
                local_130.neg = bStack_304;
                local_130.fpclass = (fpclass_type)local_300;
                local_130.prec_elem = local_300._4_4_;
                if ((fpclass_type)local_300 != cpp_dec_float_finite ||
                    local_130.data._M_elems[0] != 0) {
                  local_130.neg = (bool)(bStack_304 ^ 1);
                }
                pDVar22 = (DataKey *)&local_2f8;
                pcVar24 = &local_b0;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar24->data)._M_elems[0] = pDVar22->info;
                  pDVar22 = (DataKey *)&pDVar22[-(ulong)bVar31].idx;
                  pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar24 + (ulong)bVar31 * -8 + 4);
                }
                local_b0.exp = local_2f8.exp;
                local_b0.neg = local_2f8.neg;
                local_b0.fpclass = local_2f8.fpclass;
                local_b0.prec_elem = local_2f8.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          (&local_b0,(cpp_dec_float<200U,_int,_void> *)local_1b0);
                if (((local_130.fpclass == cpp_dec_float_NaN) ||
                    (local_b0.fpclass == cpp_dec_float_NaN)) ||
                   (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_130,&local_b0), iVar16 < 1)) goto LAB_00593188;
              }
              else {
                iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_378,&local_238);
                if (iVar16 < 1) {
                  goto LAB_00593091;
                }
              }
              (this->forbidden).data[iVar14] = 1;
              local_3d0 = (ulong)((int)local_3d0 - 1);
            }
LAB_00593188:
            uVar13 = uVar13 - 1;
            lVar11 = lVar11 + -0x84;
          } while (1 < uVar13);
        }
        uVar28 = (int)local_3d0 - 1;
        local_3d0 = (ulong)uVar28;
        uVar13 = local_388;
        if (uVar28 == 0) {
          iVar14 = (int)local_388;
          if (base->theRep == COLUMN) {
            for (; (-1 < (int)local_3bc && ((int)local_3bc < iVar15));
                local_3bc = local_3bc + iVar14) {
              setPrimalStatus(this,&local_278,base,local_3b0 + local_3bc);
            }
            if (0 < (long)local_390->thesize) {
              uVar29 = (long)local_390->thesize;
              do {
                if ((this->forbidden).data[uVar29 - 1] < 2) {
                  local_378 = (undefined1  [8])
                              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId(base,(int)uVar29 + -1);
                  setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_278,base,(SPxId *)local_378);
                }
                bVar30 = 1 < uVar29;
                uVar29 = uVar29 - 1;
              } while (bVar30);
            }
          }
          else {
            for (; (-1 < (int)local_3bc && ((int)local_3bc < iVar15));
                local_3bc = local_3bc + iVar14) {
              setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_278,base,local_3b0 + local_3bc);
            }
            if (0 < (long)local_390->thesize) {
              uVar29 = (long)local_390->thesize;
              do {
                if ((this->forbidden).data[uVar29 - 1] < 2) {
                  local_378 = (undefined1  [8])
                              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId(base,(int)uVar29 + -1);
                  setPrimalStatus(this,&local_278,base,(SPxId *)local_378);
                }
                bVar30 = 1 < uVar29;
                uVar29 = uVar29 - 1;
              } while (bVar30);
            }
          }
          break;
        }
      }
      else {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_378,this_03);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_378;
        puVar20 = (uint *)local_1b0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar20 = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar31 * -2 + 1) * 4);
          puVar20 = puVar20 + (ulong)bVar31 * -2 + 1;
        }
        local_140 = iStack_308;
        local_13c = bStack_304;
        local_138 = (fpclass_type)local_300;
        iStack_134 = local_300._4_4_;
        lVar11 = (long)this_03->memused;
        if (0 < lVar11) {
          local_398 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(local_398._4_4_,
                                  (base->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .set.thenum);
          uVar13 = lVar11 + 1;
          lVar11 = lVar11 * 0x84 + -4;
          local_3a0 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0xffffffff;
          do {
            pNVar8 = this_03->m_elem;
            puVar20 = (uint *)((long)(pNVar8->val).m_backend.data._M_elems + lVar11);
            puVar18 = puVar20 + -0x20;
            ppnVar19 = (pointer *)&local_130;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *(uint *)ppnVar19 = *puVar18;
              puVar18 = puVar18 + (ulong)bVar31 * -2 + 1;
              ppnVar19 = (pointer *)((long)ppnVar19 + ((ulong)bVar31 * -2 + 1) * 4);
            }
            uVar28 = *puVar20;
            if ((this->forbidden).data[(int)uVar28] == 0) {
              iVar14 = *(int *)((long)(pNVar8->val).m_backend.data._M_elems + lVar11 + -0x10);
              bVar3 = *(byte *)((long)(pNVar8->val).m_backend.data._M_elems + lVar11 + -0xc);
              uVar1 = *(undefined8 *)((long)(pNVar8->val).m_backend.data._M_elems + lVar11 + -8);
              iVar16 = (base->thecovectors->set).theitem
                       [(base->thecovectors->set).thekey[(int)uVar28].idx].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
              ppnVar19 = (pointer *)&local_130;
              pDVar22 = (DataKey *)&local_2f8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                pDVar22->info = *(int *)ppnVar19;
                ppnVar19 = (pointer *)((long)ppnVar19 + (ulong)bVar31 * -8 + 4);
                pDVar22 = (DataKey *)&pDVar22[-(ulong)bVar31].idx;
              }
              local_2f8.neg = (bool)bVar3;
              if ((bVar3 != 0) &&
                 ((fpclass_type)uVar1 != cpp_dec_float_finite || local_2f8.data._M_elems[0] != 0)) {
                local_2f8.neg = (bool)(bVar3 ^ 1);
              }
              local_2f8.exp = iVar14;
              local_2f8._120_8_ = uVar1;
              iVar14 = (*(this->
                         super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxStarter[6])();
              dVar2 = *(double *)(*(long *)CONCAT44(extraout_var,iVar14) + 0x40);
              uVar32 = -(ulong)(dVar2 == 1.0);
              local_238.fpclass = cpp_dec_float_finite;
              local_238.prec_elem = 0x1c;
              local_238.data._M_elems[0] = 0;
              local_238.data._M_elems[1] = 0;
              local_238.data._M_elems[2] = 0;
              local_238.data._M_elems[3] = 0;
              local_238.data._M_elems[4] = 0;
              local_238.data._M_elems[5] = 0;
              local_238.data._M_elems[6] = 0;
              local_238.data._M_elems[7] = 0;
              local_238.data._M_elems[8] = 0;
              local_238.data._M_elems[9] = 0;
              local_238.data._M_elems[10] = 0;
              local_238.data._M_elems[0xb] = 0;
              local_238.data._M_elems[0xc] = 0;
              local_238.data._M_elems[0xd] = 0;
              local_238.data._M_elems[0xe] = 0;
              local_238.data._M_elems[0xf] = 0;
              local_238.data._M_elems[0x10] = 0;
              local_238.data._M_elems[0x11] = 0;
              local_238.data._M_elems[0x12] = 0;
              local_238.data._M_elems[0x13] = 0;
              local_238.data._M_elems[0x14] = 0;
              local_238.data._M_elems[0x15] = 0;
              local_238.data._M_elems[0x16] = 0;
              local_238.data._M_elems[0x17] = 0;
              local_238.data._M_elems[0x18] = 0;
              local_238.data._M_elems[0x19] = 0;
              local_238.data._M_elems._104_5_ = 0;
              local_238.data._M_elems[0x1b]._1_3_ = 0;
              local_238.exp = 0;
              local_238.neg = false;
              local_300._0_4_ = cpp_dec_float_finite;
              local_300._4_4_ = 0x1c;
              local_378._0_4_ = 0;
              local_378._4_4_ = 0;
              piStack_370 = (int *)0x0;
              local_368[0] = 0;
              local_368[1] = 0;
              local_368[2] = 0;
              local_368[3] = 0;
              local_368[4] = 0;
              local_368[5] = 0;
              local_368[6] = 0;
              local_368[7] = 0;
              local_368[8] = 0;
              local_368[9] = 0;
              local_368[10] = 0;
              local_368[0xb] = 0;
              local_368[0xc] = 0;
              local_368[0xd] = 0;
              local_368[0xe] = 0;
              local_368[0xf] = 0;
              local_368[0x10] = 0;
              local_368[0x11] = 0;
              local_368[0x12] = 0;
              local_368[0x13] = 0;
              local_368[0x14] = 0;
              local_368[0x15] = 0;
              stack0xfffffffffffffcf0 = 0;
              uStack_30b = 0;
              iStack_308 = 0;
              bStack_304 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_378,
                         (double)(~uVar32 & (ulong)(dVar2 * 0.001) | uVar32 & 0x3f50624dd2f1a9fc));
              puVar20 = (uint *)local_1b0;
              pcVar24 = &local_238;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar24->data)._M_elems[0] = *puVar20;
                puVar20 = puVar20 + (ulong)bVar31 * -2 + 1;
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar31 * -8 + 4)
                ;
              }
              local_238.exp = local_140;
              local_238.neg = local_13c;
              local_238.fpclass = local_138;
              local_238.prec_elem = iStack_134;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&local_238,(cpp_dec_float<200U,_int,_void> *)local_378);
              if (((local_2f8.fpclass != cpp_dec_float_NaN) &&
                  (local_238.fpclass != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_2f8,&local_238), 0 < iVar14)) {
                local_3a0 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((ulong)local_3a0 & 0xffffffff);
                iVar14 = (int)local_398;
                if (iVar16 < (int)local_398) {
                  local_3a0 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)(ulong)uVar28;
                  iVar14 = iVar16;
                }
                local_398 = (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(local_398._4_4_,iVar14);
              }
            }
            uVar13 = uVar13 - 1;
            lVar11 = lVar11 + -0x84;
          } while (1 < uVar13);
          uVar28 = (uint)local_3a0;
          uVar13 = local_388;
          goto LAB_00592e6e;
        }
LAB_00592eb0:
        if (base->theRep == COLUMN) {
          setPrimalStatus(this,&local_278,base,local_3b0 + uVar29);
        }
        else {
          setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_278,base,local_3b0 + uVar29);
        }
      }
      uVar28 = (int)uVar29 + (int)uVar13;
      uVar29 = (ulong)uVar28;
    } while ((-1 < (int)uVar28) && (local_3bc = local_3bc + (int)uVar13, (int)uVar28 < iVar15));
  }
  (*(base->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x58])(base,&local_278);
  if (local_3b0 != (SPxId *)0x0) {
    free(local_3b0);
  }
  if (local_278.colstat.data != (Status *)0x0) {
    free(local_278.colstat.data);
    local_278.colstat.data = (Status *)0x0;
  }
  if (local_278.rowstat.data != (Status *)0x0) {
    free(local_278.rowstat.data);
  }
  return;
}

Assistant:

void SPxWeightST<R>::generate(SPxSolverBase<R>& base)
{
   SPxId tmpId;

   forbidden.reSize(base.dim());
   rowWeight.reSize(base.nRows());
   colWeight.reSize(base.nCols());
   rowRight.reSize(base.nRows());
   colUp.reSize(base.nCols());

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      weight   = &colWeight;
      coWeight = &rowWeight;
   }
   else
   {
      weight   = &rowWeight;
      coWeight = &colWeight;
   }

   assert(weight->size()   == base.coDim());
   assert(coWeight->size() == base.dim());

   setupWeights(base);

   typename SPxBasisBase<R>::Desc desc(base);
   //   desc.reSize(base.nRows(), base.nCols());

   DataArray < SPxId > pref(base.nRows() + base.nCols());
   initPrefs(pref, base, rowWeight, colWeight);

   int i;
   int stepi;
   int j;
   int sel;

   for(i = 0; i < base.dim(); ++i)
      forbidden[i] = 0;

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      // in COLUMN rep we scan from beginning to end
      i      = 0;
      stepi = 1;
   }
   else
   {
      // in ROW rep we scan from end to beginning
      i      = pref.size() - 1;
      stepi = -1;
   }

   int  dim = base.dim();
   R maxEntry = 0;

   for(; i >= 0 && i < pref.size(); i += stepi)
   {
      tmpId              = pref[i];
      const SVectorBase<R>& vec = base.vector(tmpId);
      sel                = -1;

      // column or row singleton ?
      if(vec.size() == 1)
      {
         int idx = vec.index(0);

         if(forbidden[idx] < 2)
         {
            sel  = idx;
            dim += (forbidden[idx] > 0) ? 1 : 0;
         }
      }
      else
      {
         maxEntry = vec.maxAbs();

         // initialize the nonzero counter
         int minRowEntries = base.nRows();

         // find a stable index with a sparse row/column
         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            int  nRowEntries = base.coVector(k).size();

            if(!forbidden[k]
                  && (spxAbs(x) > this->tolerances()->scaleAccordingToEpsilon(SOPLEX_STABLE) * maxEntry)
                  && (nRowEntries < minRowEntries))
            {
               minRowEntries = nRowEntries;
               sel  = k;
            }
         }
      }

      // we found a valid index
      if(sel >= 0)
      {
         SPX_DEBUG(

            if(pref[i].type() == SPxId::ROW_ID)
            std::cout << "DWEIST01 r" << base.number(pref[i]);
            else
               std::cout << "DWEIST02 c" << base.number(pref[i]);
            )

               forbidden[sel] = 2;

         // put current column/row into basis
         if(base.rep() == SPxSolverBase<R>::COLUMN)
            setDualStatus(desc, base, pref[i]);
         else
            setPrimalStatus(desc, base, pref[i]);

         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            R feastol = this->tolerances()->floatingPointFeastol();

            if(!forbidden[k] && (x > feastol * maxEntry || -x > feastol * maxEntry))
            {
               forbidden[k] = 1;
               --dim;
            }
         }

         if(--dim == 0)
         {
            //@ for(++i; i < pref.size(); ++i)
            if(base.rep() == SPxSolverBase<R>::COLUMN)
            {
               // set all remaining indeces to nonbasic status
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setPrimalStatus(desc, base, pref[i]);

               // fill up the basis wherever linear independence is assured
               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setDualStatus(desc, base, base.coId(i));
               }
            }
            else
            {
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setDualStatus(desc, base, pref[i]);

               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setPrimalStatus(desc, base, base.coId(i));
               }
            }

            break;
         }
      }
      // sel == -1
      else if(base.rep() == SPxSolverBase<R>::COLUMN)
         setPrimalStatus(desc, base, pref[i]);
      else
         setDualStatus(desc, base, pref[i]);

#ifndef NDEBUG
      {
         int n, m;

         for(n = 0, m = forbidden.size(); n < forbidden.size(); ++n)
            m -= (forbidden[n] != 0) ? 1 : 0;

         assert(m == dim);
      }
#endif  // NDEBUG
   }

   assert(dim == 0);

   base.loadBasis(desc);
#ifdef  TEST
   base.init();

   int changed = 0;
   const VectorBase<R>& pvec = base.pVec();

   for(i = pvec.dim() - 1; i >= 0; --i)
   {
      if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_UPPER
            && base.lower(i) > R(-infinity) && pvec[i] > base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
              && base.upper(i) < R(infinity) && pvec[i] < base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
   }

   if(changed)
   {
      std::cout << "changed basis\n";
      base.loadBasis(desc);
   }
   else
      std::cout << "nothing changed\n";

#endif  // TEST
}